

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

DdNode * Cudd_LargestCube(DdManager *manager,DdNode *f,int *length)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  st__table *visited;
  uint *key;
  uint uVar5;
  DdNode *pDVar6;
  ulong uVar7;
  int iVar8;
  uint *puVar9;
  cuddPathPair *rootPair;
  cuddPathPair *E_pair;
  cuddPathPair *T_pair;
  DdNode *local_88;
  char *local_48;
  int *local_40;
  int *local_38;
  
  one = manager->one;
  zero = manager->zero;
  pDVar6 = (DdNode *)((ulong)one ^ 1);
  iVar3 = 1000000;
  if (zero != f && pDVar6 != f) {
    key = (uint *)((ulong)f & 0xfffffffffffffffe);
    do {
      manager->reordered = 0;
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      getLargest(f,visited);
      iVar3 = st__lookup(visited,(char *)key,&local_48);
      pDVar6 = one;
      if (iVar3 == 0) {
        return (DdNode *)0x0;
      }
      iVar3 = *(int *)(local_48 + ((uint)f * 4 & 4));
      piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (*key != 0x7fffffff) {
        local_88 = pDVar6;
        puVar9 = key;
        iVar8 = iVar3;
        uVar5 = (uint)f;
        do {
          iVar8 = iVar8 + -1;
          uVar7 = *(ulong *)(puVar9 + 6) ^ 1;
          uVar2 = *(ulong *)(puVar9 + 4) ^ 1;
          if ((uVar5 & 1) == 0) {
            uVar7 = *(ulong *)(puVar9 + 6);
            uVar2 = *(ulong *)(puVar9 + 4);
          }
          iVar4 = st__lookup(visited,(char *)(uVar2 & 0xfffffffffffffffe),(char **)&local_38);
          if (iVar4 == 0) {
LAB_0078e51d:
            pDVar6 = (DdNode *)0x0;
            goto LAB_0078e571;
          }
          uVar5 = (uint)uVar7;
          if ((uVar2 & 1) != 0) {
            if (iVar8 == local_38[1]) goto LAB_0078e482;
LAB_0078e448:
            iVar4 = st__lookup(visited,(char *)(uVar7 & 0xfffffffffffffffe),(char **)&local_40);
            if (iVar4 == 0) goto LAB_0078e51d;
            if ((uVar7 & 1) == 0) {
              iVar4 = *local_40;
            }
            else {
              iVar4 = local_40[1];
            }
            if (iVar8 == iVar4) {
              pDVar6 = cuddBddAndRecur(manager,(DdNode *)((ulong)manager->vars[*puVar9] ^ 1),
                                       local_88);
              puVar9 = (uint *)(uVar7 & 0xfffffffffffffffe);
              goto joined_r0x0078e4a5;
            }
            fwrite("We shouldn\'t be here!\n",0x16,1,(FILE *)manager->err);
            manager->errorCode = CUDD_INTERNAL_ERROR;
LAB_0078e56f:
            pDVar6 = (DdNode *)0x0;
            goto LAB_0078e571;
          }
          if (iVar8 != *local_38) goto LAB_0078e448;
LAB_0078e482:
          pDVar6 = cuddBddAndRecur(manager,manager->vars[*puVar9],local_88);
          puVar9 = (uint *)(uVar2 & 0xfffffffffffffffe);
          uVar5 = (uint)uVar2;
joined_r0x0078e4a5:
          if (pDVar6 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,local_88);
            goto LAB_0078e56f;
          }
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(manager,local_88);
          local_88 = pDVar6;
        } while (*puVar9 != 0x7fffffff);
      }
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
LAB_0078e571:
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    } while (manager->reordered == 1);
  }
  *length = iVar3;
  return pDVar6;
}

Assistant:

DdNode *
Cudd_LargestCube(
  DdManager * manager,
  DdNode * f,
  int * length)
{
    register    DdNode  *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    if (f == Cudd_Not(one) || f == zero) {
        *length = DD_BIGGY;
        return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getLargest(f, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getCube(manager,visited,f,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}